

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall el::base::LogFormat::operator==(LogFormat *this,LogFormat *other)

{
  __type _Var1;
  
  if (this->m_level != other->m_level) {
    return false;
  }
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &this->m_userFormat,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &other->m_userFormat);
  if (((_Var1) &&
      (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &this->m_format,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &other->m_format), _Var1)) &&
     (_Var1 = std::operator==(&this->m_dateTimeFormat,&other->m_dateTimeFormat), _Var1)) {
    return this->m_flags == other->m_flags;
  }
  return false;
}

Assistant:

bool LogFormat::operator==(const LogFormat& other) {
  return m_level == other.m_level && m_userFormat == other.m_userFormat && m_format == other.m_format &&
         m_dateTimeFormat == other.m_dateTimeFormat && m_flags == other.m_flags;
}